

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vdbeSorterExtendFile(sqlite3 *db,sqlite3_file *pFd,i64 nByte)

{
  long in_FS_OFFSET;
  int chunksize;
  void *p;
  i64 nByte_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  nByte_local = nByte;
  if ((nByte <= db->nMaxSorterMmap) && (2 < pFd->pMethods->iVersion)) {
    p = (void *)0x0;
    chunksize = 0x1000;
    (*pFd->pMethods->xFileControl)(pFd,6,&chunksize);
    (*pFd->pMethods->xFileControl)(pFd,5,&nByte_local);
    (*pFd->pMethods->xFetch)(pFd,0,(int)nByte_local,&p);
    if (p != (void *)0x0) {
      (*pFd->pMethods->xUnfetch)(pFd,0,p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void vdbeSorterExtendFile(sqlite3 *db, sqlite3_file *pFd, i64 nByte){
  if( nByte<=(i64)(db->nMaxSorterMmap) && pFd->pMethods->iVersion>=3 ){
    void *p = 0;
    int chunksize = 4*1024;
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_CHUNK_SIZE, &chunksize);
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_SIZE_HINT, &nByte);
    sqlite3OsFetch(pFd, 0, (int)nByte, &p);
    if( p ) sqlite3OsUnfetch(pFd, 0, p);
  }
}